

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxColRatio(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *__return_storage_ptr__,
             SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *lp)

{
  double a;
  byte bVar1;
  fpclass_type fVar2;
  int32_t iVar3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar4;
  int iVar5;
  Item *pIVar6;
  int32_t *piVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  uint *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  long lVar15;
  long in_FS_OFFSET;
  byte bVar16;
  Real a_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<200U,_int,_void> local_3b8;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_330;
  long local_328;
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_320;
  cpp_dec_float<200U,_int,_void> local_318;
  cpp_dec_float<200U,_int,_void> local_298;
  cpp_dec_float<200U,_int,_void> local_218;
  cpp_dec_float<200U,_int,_void> local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar16 = 0;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x1c;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x11] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x12] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x13] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x14] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x15] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x16] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x17] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x18] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x19] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1a] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0x1b] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x6d) = 0;
  local_320 = this;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < (lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    a = *(double *)(in_FS_OFFSET + -8);
    local_328 = 0;
    local_330 = lp;
    do {
      pIVar6 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[local_328].idx;
      ::soplex::infinity::__tls_init();
      local_298.fpclass = cpp_dec_float_finite;
      local_298.prec_elem = 0x1c;
      local_298.data._M_elems[0] = 0;
      local_298.data._M_elems[1] = 0;
      local_298.data._M_elems[2] = 0;
      local_298.data._M_elems[3] = 0;
      local_298.data._M_elems[4] = 0;
      local_298.data._M_elems[5] = 0;
      local_298.data._M_elems[6] = 0;
      local_298.data._M_elems[7] = 0;
      local_298.data._M_elems[8] = 0;
      local_298.data._M_elems[9] = 0;
      local_298.data._M_elems[10] = 0;
      local_298.data._M_elems[0xb] = 0;
      local_298.data._M_elems[0xc] = 0;
      local_298.data._M_elems[0xd] = 0;
      local_298.data._M_elems[0xe] = 0;
      local_298.data._M_elems[0xf] = 0;
      local_298.data._M_elems[0x10] = 0;
      local_298.data._M_elems[0x11] = 0;
      local_298.data._M_elems[0x12] = 0;
      local_298.data._M_elems[0x13] = 0;
      local_298.data._M_elems[0x14] = 0;
      local_298.data._M_elems[0x15] = 0;
      local_298.data._M_elems[0x16] = 0;
      local_298.data._M_elems[0x17] = 0;
      local_298.data._M_elems[0x18] = 0;
      local_298.data._M_elems[0x19] = 0;
      local_298.data._M_elems._104_5_ = 0;
      local_298.data._M_elems[0x1b]._1_3_ = 0;
      local_298.exp = 0;
      local_298.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_298,a);
      local_218.fpclass = cpp_dec_float_finite;
      local_218.prec_elem = 0x1c;
      local_218.data._M_elems[0] = 0;
      local_218.data._M_elems[1] = 0;
      local_218.data._M_elems[2] = 0;
      local_218.data._M_elems[3] = 0;
      local_218.data._M_elems[4] = 0;
      local_218.data._M_elems[5] = 0;
      local_218.data._M_elems[6] = 0;
      local_218.data._M_elems[7] = 0;
      local_218.data._M_elems[8] = 0;
      local_218.data._M_elems[9] = 0;
      local_218.data._M_elems[10] = 0;
      local_218.data._M_elems[0xb] = 0;
      local_218.data._M_elems[0xc] = 0;
      local_218.data._M_elems[0xd] = 0;
      local_218.data._M_elems[0xe] = 0;
      local_218.data._M_elems[0xf] = 0;
      local_218.data._M_elems[0x10] = 0;
      local_218.data._M_elems[0x11] = 0;
      local_218.data._M_elems[0x12] = 0;
      local_218.data._M_elems[0x13] = 0;
      local_218.data._M_elems[0x14] = 0;
      local_218.data._M_elems[0x15] = 0;
      local_218.data._M_elems[0x16] = 0;
      local_218.data._M_elems[0x17] = 0;
      local_218.data._M_elems[0x18] = 0;
      local_218.data._M_elems[0x19] = 0;
      local_218.data._M_elems._104_5_ = 0;
      local_218.data._M_elems[0x1b]._1_3_ = 0;
      local_218.exp = 0;
      local_218.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_218,0.0);
      if (0 < (pIVar6->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar9 = 0x7c;
        lVar15 = 0;
        do {
          piVar7 = (int32_t *)
                   ((long)&(((pIVar6->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem)->val).m_backend.data + lVar9);
          puVar10 = (uint *)(piVar7 + -0x1f);
          puVar12 = local_a0;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar12 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
          }
          iVar5 = piVar7[-3];
          bVar1 = *(byte *)(piVar7 + -2);
          fVar2 = piVar7[-1];
          iVar3 = *piVar7;
          local_318.fpclass = cpp_dec_float_finite;
          local_318.prec_elem = 0x1c;
          local_318.neg = false;
          local_318.exp = 0;
          puVar10 = local_a0;
          pcVar11 = &local_318;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_318.exp = iVar5;
          local_318.neg = (bool)bVar1;
          local_318.prec_elem = iVar3;
          local_318.fpclass = fVar2;
          if ((bVar1 == 1) && (local_318.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)) {
            local_318.neg = false;
          }
          bVar4 = local_318.neg;
          puVar10 = local_a0;
          puVar12 = local_110;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            *puVar12 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
          }
          this_00 = (local_320->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (local_320->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          a_00 = Tolerances::epsilon(this_00);
          puVar10 = local_110;
          pcVar11 = &local_190;
          for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
            (pcVar11->data)._M_elems[0] = *puVar10;
            puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          local_190.exp = iVar5;
          local_190.neg = bVar4;
          local_190.prec_elem = iVar3;
          local_190.fpclass = fVar2;
          if ((bVar4 != false) && (local_190.data._M_elems[0] != 0 || fVar2 != cpp_dec_float_finite)
             ) {
            local_190.neg = (bool)(bVar4 ^ 1);
          }
          bVar4 = false;
          if ((fVar2 != cpp_dec_float_NaN) && (!NAN(a_00))) {
            local_3b8.fpclass = cpp_dec_float_finite;
            local_3b8.prec_elem = 0x1c;
            local_3b8.data._M_elems[0] = 0;
            local_3b8.data._M_elems[1] = 0;
            local_3b8.data._M_elems[2] = 0;
            local_3b8.data._M_elems[3] = 0;
            local_3b8.data._M_elems[4] = 0;
            local_3b8.data._M_elems[5] = 0;
            local_3b8.data._M_elems[6] = 0;
            local_3b8.data._M_elems[7] = 0;
            local_3b8.data._M_elems[8] = 0;
            local_3b8.data._M_elems[9] = 0;
            local_3b8.data._M_elems[10] = 0;
            local_3b8.data._M_elems[0xb] = 0;
            local_3b8.data._M_elems[0xc] = 0;
            local_3b8.data._M_elems[0xd] = 0;
            local_3b8.data._M_elems[0xe] = 0;
            local_3b8.data._M_elems[0xf] = 0;
            local_3b8.data._M_elems[0x10] = 0;
            local_3b8.data._M_elems[0x11] = 0;
            local_3b8.data._M_elems[0x12] = 0;
            local_3b8.data._M_elems[0x13] = 0;
            local_3b8.data._M_elems[0x14] = 0;
            local_3b8.data._M_elems[0x15] = 0;
            local_3b8.data._M_elems[0x16] = 0;
            local_3b8.data._M_elems[0x17] = 0;
            local_3b8.data._M_elems[0x18] = 0;
            local_3b8.data._M_elems[0x19] = 0;
            local_3b8.data._M_elems._104_5_ = 0;
            local_3b8.data._M_elems[0x1b]._1_3_ = 0;
            local_3b8.exp = 0;
            local_3b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_3b8,a_00);
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_190,&local_3b8);
            bVar4 = iVar5 < 1;
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          if (!bVar4) {
            if (((local_318.fpclass != cpp_dec_float_NaN) &&
                (local_298.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_318,&local_298), iVar5 < 0)) {
              pcVar11 = &local_318;
              pcVar13 = &local_298;
              for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_298.exp = local_318.exp;
              local_298.neg = local_318.neg;
              local_298.fpclass = local_318.fpclass;
              local_298.prec_elem = local_318.prec_elem;
            }
            if (((local_318.fpclass != cpp_dec_float_NaN) &&
                (local_218.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&local_318,&local_218), 0 < iVar5)) {
              pcVar11 = &local_318;
              pcVar13 = &local_218;
              for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
                (pcVar13->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
                pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar16 * -8 + 4)
                ;
              }
              local_218.exp = local_318.exp;
              local_218.neg = local_318.neg;
              local_218.fpclass = local_318.fpclass;
              local_218.prec_elem = local_318.prec_elem;
            }
          }
          lVar15 = lVar15 + 1;
          lVar9 = lVar9 + 0x84;
        } while (lVar15 < (pIVar6->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      ::soplex::infinity::__tls_init();
      local_3b8.fpclass = cpp_dec_float_finite;
      local_3b8.prec_elem = 0x1c;
      local_3b8.data._M_elems[0] = 0;
      local_3b8.data._M_elems[1] = 0;
      local_3b8.data._M_elems[2] = 0;
      local_3b8.data._M_elems[3] = 0;
      local_3b8.data._M_elems[4] = 0;
      local_3b8.data._M_elems[5] = 0;
      local_3b8.data._M_elems[6] = 0;
      local_3b8.data._M_elems[7] = 0;
      local_3b8.data._M_elems[8] = 0;
      local_3b8.data._M_elems[9] = 0;
      local_3b8.data._M_elems[10] = 0;
      local_3b8.data._M_elems[0xb] = 0;
      local_3b8.data._M_elems[0xc] = 0;
      local_3b8.data._M_elems[0xd] = 0;
      local_3b8.data._M_elems[0xe] = 0;
      local_3b8.data._M_elems[0xf] = 0;
      local_3b8.data._M_elems[0x10] = 0;
      local_3b8.data._M_elems[0x11] = 0;
      local_3b8.data._M_elems[0x12] = 0;
      local_3b8.data._M_elems[0x13] = 0;
      local_3b8.data._M_elems[0x14] = 0;
      local_3b8.data._M_elems[0x15] = 0;
      local_3b8.data._M_elems[0x16] = 0;
      local_3b8.data._M_elems[0x17] = 0;
      local_3b8.data._M_elems[0x18] = 0;
      local_3b8.data._M_elems[0x19] = 0;
      local_3b8.data._M_elems._104_5_ = 0;
      local_3b8.data._M_elems[0x1b]._1_3_ = 0;
      local_3b8.exp = 0;
      local_3b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_3b8,a);
      lp = local_330;
      if (((local_298.fpclass == cpp_dec_float_NaN) || (local_3b8.fpclass == cpp_dec_float_NaN)) ||
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_298,&local_3b8), iVar5 != 0)) {
        local_3b8.fpclass = cpp_dec_float_finite;
        local_3b8.prec_elem = 0x1c;
        local_3b8.data._M_elems[0] = 0;
        local_3b8.data._M_elems[1] = 0;
        local_3b8.data._M_elems[2] = 0;
        local_3b8.data._M_elems[3] = 0;
        local_3b8.data._M_elems[4] = 0;
        local_3b8.data._M_elems[5] = 0;
        local_3b8.data._M_elems[6] = 0;
        local_3b8.data._M_elems[7] = 0;
        local_3b8.data._M_elems[8] = 0;
        local_3b8.data._M_elems[9] = 0;
        local_3b8.data._M_elems[10] = 0;
        local_3b8.data._M_elems[0xb] = 0;
        local_3b8.data._M_elems[0xc] = 0;
        local_3b8.data._M_elems[0xd] = 0;
        local_3b8.data._M_elems[0xe] = 0;
        local_3b8.data._M_elems[0xf] = 0;
        local_3b8.data._M_elems[0x10] = 0;
        local_3b8.data._M_elems[0x11] = 0;
        local_3b8.data._M_elems[0x12] = 0;
        local_3b8.data._M_elems[0x13] = 0;
        local_3b8.data._M_elems[0x14] = 0;
        local_3b8.data._M_elems[0x15] = 0;
        local_3b8.data._M_elems[0x16] = 0;
        local_3b8.data._M_elems[0x17] = 0;
        local_3b8.data._M_elems[0x18] = 0;
        local_3b8.data._M_elems[0x19] = 0;
        local_3b8.data._M_elems._104_5_ = 0;
        local_3b8.data._M_elems[0x1b]._1_3_ = 0;
        local_3b8.exp = 0;
        local_3b8.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_3b8,&local_218,&local_298);
        if (((local_3b8.fpclass != cpp_dec_float_NaN) &&
            ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_3b8,&__return_storage_ptr__->m_backend), 0 < iVar5)) {
          pcVar11 = &local_3b8;
          pnVar14 = __return_storage_ptr__;
          for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
            (pnVar14->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar11 + ((ulong)bVar16 * -2 + 1) * 4);
            pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
          }
          (__return_storage_ptr__->m_backend).exp = local_3b8.exp;
          (__return_storage_ptr__->m_backend).neg = local_3b8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_3b8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_3b8.prec_elem;
        }
      }
      local_328 = local_328 + 1;
    } while (local_328 <
             (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxColRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nCols(); ++i)
   {
      const SVectorBase<R>& vec  = lp.colVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}